

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_action.cpp
# Opt level: O0

void __thiscall DCorpsePointer::Destroy(DCorpsePointer *this)

{
  DWORD DVar1;
  bool bVar2;
  AActor *pAVar3;
  DCorpsePointer *pDStack_30;
  int prevCount;
  DCorpsePointer *first;
  TThinkerIterator<DCorpsePointer> iterator;
  DCorpsePointer *this_local;
  
  iterator.super_FThinkerIterator._16_8_ = this;
  TThinkerIterator<DCorpsePointer>::TThinkerIterator((TThinkerIterator<DCorpsePointer> *)&first,3);
  pDStack_30 = TThinkerIterator<DCorpsePointer>::Next((TThinkerIterator<DCorpsePointer> *)&first);
  DVar1 = pDStack_30->Count;
  if (pDStack_30 == this) {
    pDStack_30 = TThinkerIterator<DCorpsePointer>::Next((TThinkerIterator<DCorpsePointer> *)&first);
  }
  if (pDStack_30 != (DCorpsePointer *)0x0) {
    pDStack_30->Count = DVar1 - 1;
  }
  bVar2 = TObjPtr<AActor>::operator!=(&this->Corpse,(AActor *)0x0);
  if (bVar2) {
    pAVar3 = TObjPtr<AActor>::operator->(&this->Corpse);
    (*(pAVar3->super_DThinker).super_DObject._vptr_DObject[4])();
  }
  DThinker::Destroy(&this->super_DThinker);
  return;
}

Assistant:

void DCorpsePointer::Destroy ()
{
	// Store the count of corpses in the first thinker in the list
	TThinkerIterator<DCorpsePointer> iterator (STAT_CORPSEPOINTER);
	DCorpsePointer *first = iterator.Next ();

	int prevCount = first->Count;

	if (first == this)
	{
		first = iterator.Next ();
	}

	if (first != NULL)
	{
		first->Count = prevCount - 1;
	}

	if (Corpse != NULL)
	{
		Corpse->Destroy ();
	}
	Super::Destroy ();
}